

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestToStringVisitor.cpp
# Opt level: O3

void anon_unknown.dwarf_397711::_DOCTEST_ANON_FUNC_9(void)

{
  _DOCTEST_ANON_CLASS_8 v;
  undefined1 auStack_598 [376];
  OstreamBuffer local_420;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_598);
  binlog::detail::OstreamBuffer::OstreamBuffer(&local_420,(ostream *)auStack_598);
  _DOCTEST_ANON_CLASS_8::f((_DOCTEST_ANON_CLASS_8 *)auStack_598);
  binlog::detail::OstreamBuffer::~OstreamBuffer(&local_420);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_598);
  std::ios_base::~ios_base((ios_base *)(auStack_598 + 0x70));
  return;
}

Assistant:

std::string result()
  {
    buf.flush();
    return str.str();
  }